

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O0

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc_from_cscmat<bool,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *cscmat_file_path,string *rate_adaption_file_path)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows_to_combine;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> row_idx;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pair;
  string *rate_adaption_file_path_local;
  string *cscmat_file_path_local;
  
  __return_storage_ptr___00 =
       &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  pair.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)cscmat_file_path;
  read_matrix_from_cscmat<unsigned_int,unsigned_int>
            ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)__return_storage_ptr___00,(LDPC4QKD *)this,cscmat_file_path);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr___00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &pair.first.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pair.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    rows_to_combine.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    read_rate_adaption_from_csv<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
               (string *)
               pair.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_e0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_f8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,&local_c8,&local_e0,&local_f8,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
    rows_to_combine.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *)&colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode< idx_t> load_ldpc_from_cscmat(
            const std::string &cscmat_file_path, const std::string &rate_adaption_file_path=""
    ) {
        auto pair = LDPC4QKD::read_matrix_from_cscmat<idx_t>(cscmat_file_path);
        auto colptr = pair.first;
        auto row_idx = pair.second;

        if(rate_adaption_file_path.empty()) {
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx);
        } else {
            std::vector<idx_t> rows_to_combine = read_rate_adaption_from_csv<idx_t>(rate_adaption_file_path);
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx, rows_to_combine);
        }
    }